

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupRemovePis(Gia_Man_t *p,int nRemPis)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iLit1;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pObj;
  int v;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  v = 1;
  do {
    if ((p->nObjs <= v) || (pObj = Gia_ManObj(p,v), pObj == (Gia_Obj_t *)0x0)) {
      Gia_ManSetRegNum(p_00,p->nRegs);
      return p_00;
    }
    uVar1 = *(ulong *)pObj;
    uVar3 = (uint)uVar1;
    uVar4 = (uint)(uVar1 & 0x1fffffff);
    if ((uVar1 & 0x1fffffff) == 0x1fffffff || (uVar1 >> 0x1f & 1) != 0) {
      if ((~uVar3 & 0x9fffffff) == 0) {
        iVar2 = Gia_ObjCioId(pObj);
        if (iVar2 < p->vCis->nSize - nRemPis) {
          uVar3 = Gia_ManAppendCi(p_00);
          goto LAB_001d53f9;
        }
        uVar3 = (uint)*(undefined8 *)pObj;
        uVar4 = uVar3 & 0x1fffffff;
      }
      if (uVar4 != 0x1fffffff && (uVar3 & 0x80000000) != 0) {
        iVar2 = Gia_ObjFanin0Copy(pObj);
        uVar3 = Gia_ManAppendCo(p_00,iVar2);
        goto LAB_001d53f9;
      }
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar3 = Gia_ManAppendAnd(p_00,iVar2,iLit1);
LAB_001d53f9:
      pObj->Value = uVar3;
    }
    v = v + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupRemovePis( Gia_Man_t * p, int nRemPis )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) && Gia_ObjCioId(pObj) < Gia_ManCiNum(p)-nRemPis )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}